

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::lts_20250127::debugging_internal::ParseType(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ComplexityGuard guard;
  char *pcVar11;
  undefined8 *puVar12;
  ParseState copy;
  int number;
  ulong local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  iVar2 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar2 + 1;
  state->steps = iVar3 + 1;
  if (0x1ffff < iVar3 || 0xff < iVar2) {
    bVar8 = false;
    goto LAB_00356d1c;
  }
  uVar5 = (state->parse_state).mangled_idx;
  uVar6 = (state->parse_state).out_cur_idx;
  uVar7 = *(undefined8 *)&(state->parse_state).prev_name_idx;
  bVar8 = ParseCVQualifiers(state);
  pPVar1 = &state->parse_state;
  if (bVar8) {
    bVar8 = ParseType(state);
  }
  else {
    pPVar1->mangled_idx = uVar5;
    pPVar1->out_cur_idx = uVar6;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
    bVar8 = ParseCharClass(state,"OPRCG");
    if (!bVar8) {
      pPVar1->mangled_idx = uVar5;
      pPVar1->out_cur_idx = uVar6;
      *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
      bVar8 = ParseTwoCharToken(state,"Dp");
      if (bVar8) {
        bVar9 = ParseType(state);
        bVar8 = true;
        if (bVar9) goto LAB_00356d1c;
      }
      pPVar1->mangled_idx = uVar5;
      pPVar1->out_cur_idx = uVar6;
      *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
      iVar2 = state->recursion_depth;
      iVar3 = state->steps;
      state->recursion_depth = iVar2 + 1;
      state->steps = iVar3 + 1;
      if (iVar3 < 0x20000 && iVar2 < 0x100) {
        bVar8 = ParseTwoCharToken(state,"DB");
        if (bVar8) {
LAB_00356817:
          uVar4 = *(uint *)&(state->parse_state).field_0xc;
          *(uint *)&(state->parse_state).field_0xc = uVar4 & 0x7fffffff;
          local_48 = CONCAT44(local_48._4_4_,0xffffffff);
          bVar8 = ParseNumber(state,(int *)&local_48);
          if (bVar8) {
LAB_0035684b:
            *(uint *)&(state->parse_state).field_0xc =
                 *(uint *)&(state->parse_state).field_0xc & 0x7fffffff | uVar4 & 0x80000000;
            bVar8 = ParseOneCharToken(state,'_');
            if (bVar8) {
              MaybeAppend(state,"_BitInt(");
              if ((int)local_48 < 0) {
                MaybeAppend(state,"?");
              }
              else {
                MaybeAppendDecimal(state,(int)local_48);
              }
              pcVar11 = ")";
LAB_00356931:
              MaybeAppend(state,pcVar11);
              bVar9 = true;
              goto LAB_003569ad;
            }
          }
          else {
            bVar8 = ParseExpression(state);
            if (bVar8) goto LAB_0035684b;
          }
LAB_003569a3:
          pPVar1->mangled_idx = uVar5;
          pPVar1->out_cur_idx = uVar6;
          *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
          goto LAB_003569ab;
        }
        bVar8 = ParseTwoCharToken(state,"DU");
        if (bVar8) {
          MaybeAppend(state,"unsigned ");
          goto LAB_00356817;
        }
        bVar8 = ParseTwoCharToken(state,"DF");
        if (bVar8) {
          bVar8 = ParseThreeCharToken(state,"16b");
          if (!bVar8) {
            local_48 = local_48 & 0xffffffff00000000;
            bVar8 = ParseNumber(state,(int *)&local_48);
            if (bVar8) {
              MaybeAppend(state,"_Float");
              MaybeAppendDecimal(state,(int)local_48);
              bVar8 = ParseOneCharToken(state,'x');
              if (bVar8) {
                pcVar11 = "x";
                goto LAB_00356931;
              }
              bVar8 = ParseOneCharToken(state,'_');
              bVar9 = true;
              if (bVar8) goto LAB_003569ad;
            }
            goto LAB_003569a3;
          }
          pcVar11 = "std::bfloat16_t";
          goto LAB_00356931;
        }
        pcVar11 = "v";
        puVar12 = (undefined8 *)(kBuiltinTypeList + 8);
        do {
          if (pcVar11[1] == '\0') {
            bVar8 = ParseOneCharToken(state,*pcVar11);
LAB_003568f9:
            if (bVar8 != false) {
              pcVar11 = (char *)*puVar12;
              goto LAB_00356931;
            }
          }
          else if (pcVar11[2] == '\0') {
            bVar8 = ParseTwoCharToken(state,pcVar11);
            goto LAB_003568f9;
          }
          pcVar11 = (char *)puVar12[2];
          puVar12 = puVar12 + 3;
        } while (pcVar11 != (char *)0x0);
        bVar9 = ParseVendorExtendedType(state);
      }
      else {
LAB_003569ab:
        bVar9 = false;
      }
LAB_003569ad:
      iVar2 = state->recursion_depth;
      state->recursion_depth = iVar2 + -1;
      bVar8 = true;
      if (bVar9 != false) goto LAB_00356d1c;
      state->recursion_depth = iVar2;
      iVar3 = state->steps;
      state->steps = iVar3 + 1;
      if (iVar3 < 0x20000 && iVar2 < 0x101) {
        local_38._0_4_ = pPVar1->mangled_idx;
        local_38._4_4_ = pPVar1->out_cur_idx;
        uStack_30 = *(undefined8 *)&(state->parse_state).prev_name_idx;
        state->recursion_depth = iVar2 + 1;
        state->steps = iVar3 + 2;
        if (iVar3 < 0x1ffff && iVar2 < 0x100) {
          bVar9 = ParseTwoCharToken(state,"Do");
          if (!bVar9) {
            local_48._0_4_ = pPVar1->mangled_idx;
            local_48._4_4_ = pPVar1->out_cur_idx;
            uStack_40 = *(undefined8 *)&(state->parse_state).prev_name_idx;
            bVar9 = ParseTwoCharToken(state,"DO");
            if (bVar9) {
              bVar9 = ParseExpression(state);
              if (bVar9) {
                bVar9 = ParseOneCharToken(state,'E');
                if (bVar9) goto LAB_00356abc;
              }
            }
            pPVar1->mangled_idx = (int)local_48;
            pPVar1->out_cur_idx = local_48._4_4_;
            *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_40;
            bVar9 = ParseTwoCharToken(state,"Dw");
            if (bVar9) {
              bVar9 = ParseType(state);
              if (bVar9) {
                do {
                  bVar10 = ParseType(state);
                } while (bVar10);
                if (bVar9) {
                  bVar9 = ParseOneCharToken(state,'E');
                  if (bVar9) goto LAB_00356abc;
                }
              }
            }
            pPVar1->mangled_idx = (int)local_48;
            pPVar1->out_cur_idx = local_48._4_4_;
            *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_40;
          }
        }
LAB_00356abc:
        state->recursion_depth = state->recursion_depth + -1;
        ParseTwoCharToken(state,"Dx");
        bVar9 = ParseOneCharToken(state,'F');
        if (!bVar9) {
LAB_00356b1c:
          pPVar1->mangled_idx = (undefined4)local_38;
          pPVar1->out_cur_idx = local_38._4_4_;
          *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_30;
          goto LAB_00356b25;
        }
        ParseOneCharToken(state,'Y');
        bVar9 = ParseBareFunctionType(state);
        if (!bVar9) goto LAB_00356b1c;
        ParseCharClass(state,"RO");
        bVar9 = ParseOneCharToken(state,'E');
        if (!bVar9) goto LAB_00356b1c;
LAB_00356be7:
        state->recursion_depth = state->recursion_depth + -1;
      }
      else {
LAB_00356b25:
        state->recursion_depth = state->recursion_depth + -1;
        bVar9 = ParseClassEnumType(state);
        if (bVar9) goto LAB_00356d1c;
        iVar2 = state->recursion_depth;
        iVar3 = state->steps;
        state->recursion_depth = iVar2 + 1;
        state->steps = iVar3 + 1;
        if (iVar3 < 0x20000 && iVar2 < 0x100) {
          local_48._0_4_ = pPVar1->mangled_idx;
          local_48._4_4_ = pPVar1->out_cur_idx;
          uStack_40 = *(undefined8 *)&(state->parse_state).prev_name_idx;
          bVar9 = ParseOneCharToken(state,'A');
          if (bVar9) {
            bVar9 = ParseNumber(state,(int *)0x0);
            if (bVar9) {
              bVar9 = ParseOneCharToken(state,'_');
              if (bVar9) {
                bVar9 = ParseType(state);
                if (bVar9) goto LAB_00356be7;
              }
            }
          }
          pPVar1->mangled_idx = (int)local_48;
          pPVar1->out_cur_idx = local_48._4_4_;
          *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_40;
          bVar9 = ParseOneCharToken(state,'A');
          if (bVar9) {
            ParseExpression(state);
            bVar9 = ParseOneCharToken(state,'_');
            if (bVar9) {
              bVar9 = ParseType(state);
              if (bVar9) goto LAB_00356be7;
            }
          }
          pPVar1->mangled_idx = (int)local_48;
          pPVar1->out_cur_idx = local_48._4_4_;
          *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_40;
        }
        state->recursion_depth = state->recursion_depth + -1;
        bVar9 = ParsePointerToMemberType(state);
        if (!bVar9) {
          bVar9 = ParseDecltype(state);
          if (!bVar9) {
            bVar9 = ParseSubstitution(state,false);
            if (!bVar9) {
              bVar9 = ParseTemplateTemplateParam(state);
              if (bVar9) {
                bVar9 = ParseTemplateArgs(state);
                if (bVar9) goto LAB_00356d1c;
              }
              pPVar1->mangled_idx = uVar5;
              pPVar1->out_cur_idx = uVar6;
              *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
              bVar9 = ParseTemplateParam(state);
              if (!bVar9) {
                bVar9 = ParseTwoCharToken(state,"Dv");
                if (bVar9) {
                  bVar9 = ParseNumber(state,(int *)0x0);
                  if (bVar9) {
                    bVar9 = ParseOneCharToken(state,'_');
                    if (bVar9) {
                      bVar9 = ParseType(state);
                      if (bVar9) goto LAB_00356d1c;
                    }
                  }
                }
                pPVar1->mangled_idx = uVar5;
                pPVar1->out_cur_idx = uVar6;
                *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
                bVar9 = ParseTwoCharToken(state,"Dv");
                if (bVar9) {
                  bVar9 = ParseExpression(state);
                  if (bVar9) {
                    bVar9 = ParseOneCharToken(state,'_');
                    if (bVar9) {
                      bVar9 = ParseType(state);
                      if (bVar9) goto LAB_00356d1c;
                    }
                  }
                }
                pPVar1->mangled_idx = uVar5;
                pPVar1->out_cur_idx = uVar6;
                *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
                pcVar11 = "Dk";
                bVar9 = ParseTwoCharToken(state,"Dk");
                if (bVar9) {
                  bVar9 = ParseName(state);
                  if (bVar9) goto LAB_00356d1c;
                }
                pPVar1->mangled_idx = uVar5;
                pPVar1->out_cur_idx = uVar6;
                *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
                bVar8 = ParseLongToken(state,pcVar11);
              }
            }
          }
        }
      }
      goto LAB_00356d1c;
    }
    bVar8 = ParseType(state);
  }
  if (bVar8 == false) {
    pPVar1->mangled_idx = uVar5;
    pPVar1->out_cur_idx = uVar6;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
  }
LAB_00356d1c:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar8;
}

Assistant:

static bool ParseType(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;

  // We should check CV-qualifers, and PRGC things first.
  //
  // CV-qualifiers overlap with some operator names, but an operator name is not
  // valid as a type.  To avoid an ambiguity that can lead to exponential time
  // complexity, refuse to backtrack the CV-qualifiers.
  //
  // _Z4aoeuIrMvvE
  //  => _Z 4aoeuI        rM  v     v   E
  //         aoeu<operator%=, void, void>
  //  => _Z 4aoeuI r Mv v              E
  //         aoeu<void void::* restrict>
  //
  // By consuming the CV-qualifiers first, the former parse is disabled.
  if (ParseCVQualifiers(state)) {
    const bool result = ParseType(state);
    if (!result) state->parse_state = copy;
    return result;
  }
  state->parse_state = copy;

  // Similarly, these tag characters can overlap with other <name>s resulting in
  // two different parse prefixes that land on <template-args> in the same
  // place, such as "C3r1xI...".  So, disable the "ctor-name = C3" parse by
  // refusing to backtrack the tag characters.
  if (ParseCharClass(state, "OPRCG")) {
    const bool result = ParseType(state);
    if (!result) state->parse_state = copy;
    return result;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "Dp") && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseBuiltinType(state) || ParseFunctionType(state) ||
      ParseClassEnumType(state) || ParseArrayType(state) ||
      ParsePointerToMemberType(state) || ParseDecltype(state) ||
      // "std" on its own isn't a type.
      ParseSubstitution(state, /*accept_std=*/false)) {
    return true;
  }

  if (ParseTemplateTemplateParam(state) && ParseTemplateArgs(state)) {
    return true;
  }
  state->parse_state = copy;

  // Less greedy than <template-template-param> <template-args>.
  if (ParseTemplateParam(state)) {
    return true;
  }

  // GNU vector extension Dv <number> _ <type>
  if (ParseTwoCharToken(state, "Dv") && ParseNumber(state, nullptr) &&
      ParseOneCharToken(state, '_') && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  // GNU vector extension Dv <expression> _ <type>
  if (ParseTwoCharToken(state, "Dv") && ParseExpression(state) &&
      ParseOneCharToken(state, '_') && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "Dk") && ParseTypeConstraint(state)) {
    return true;
  }
  state->parse_state = copy;

  // For this notation see CXXNameMangler::mangleType in Clang's source code.
  // The relevant logic and its comment "not clear how to mangle this!" date
  // from 2011, so it may be with us awhile.
  return ParseLongToken(state, "_SUBSTPACK_");
}